

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_OptimizedTree.cpp
# Opt level: O2

bool __thiscall Opcode::AABBQuantizedNoLeafTree::Build(AABBQuantizedNoLeafTree *this,AABBTree *tree)

{
  AABBNoLeafNode *linear;
  undefined8 *puVar1;
  AABBNoLeafNode *pAVar2;
  AABBQuantizedNoLeafNode *pAVar3;
  sword *psVar4;
  ulong *puVar5;
  float fVar6;
  float fVar7;
  AABBQuantizedNoLeafNode *pAVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  bool bVar13;
  ulong *puVar14;
  ulong *puVar15;
  long lVar16;
  udword j;
  long lVar17;
  ulong uVar18;
  uword *puVar19;
  uword uVar20;
  ulong uVar21;
  udword uVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar34;
  float fVar38;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  ulong uVar39;
  undefined1 auVar40 [16];
  float fVar41;
  float local_50 [4];
  undefined8 local_40;
  float local_38;
  udword CurID;
  
  if (tree == (AABBTree *)0x0) {
    return false;
  }
  uVar22 = (tree->super_AABBTreeNode).mNbPrimitives;
  if (tree->mTotalNbNodes == uVar22 * 2 - 1) {
    uVar22 = uVar22 - 1;
    (this->super_AABBOptimizedTree).mNbNodes = uVar22;
    pAVar8 = this->mNodes;
    if (pAVar8 != (AABBQuantizedNoLeafNode *)0x0) {
      operator_delete__(&pAVar8[-1].mNegData,pAVar8[-1].mNegData << 5 | 8);
      this->mNodes = (AABBQuantizedNoLeafNode *)0x0;
      uVar22 = (this->super_AABBOptimizedTree).mNbNodes;
    }
    lVar17 = (ulong)uVar22 * 0x28;
    puVar14 = (ulong *)operator_new__(lVar17 + 8);
    *puVar14 = (ulong)uVar22;
    linear = (AABBNoLeafNode *)(puVar14 + 1);
    if (uVar22 != 0) {
      lVar16 = 0;
      do {
        puVar1 = (undefined8 *)((long)puVar14 + lVar16 + 0x20);
        *puVar1 = 0;
        puVar1[1] = 0;
        lVar16 = lVar16 + 0x28;
      } while (lVar17 - lVar16 != 0);
    }
    CurID = 1;
    _BuildNoLeafTree(linear,0,&CurID,&tree->super_AABBTreeNode);
    uVar21 = (ulong)(this->super_AABBOptimizedTree).mNbNodes;
    puVar15 = (ulong *)operator_new__(uVar21 * 0x20 + 8);
    pAVar8 = (AABBQuantizedNoLeafNode *)(puVar15 + 1);
    *puVar15 = uVar21;
    if (uVar21 != 0) {
      lVar17 = 0;
      do {
        puVar1 = (undefined8 *)((long)puVar15 + lVar17 + 0x18);
        *puVar1 = 0;
        puVar1[1] = 0;
        lVar17 = lVar17 + 0x20;
      } while (uVar21 * 0x20 != lVar17);
    }
    this->mNodes = pAVar8;
    fVar23 = -3.4028235e+38;
    fVar24 = -3.4028235e+38;
    fVar25 = 0.0;
    fVar26 = 0.0;
    fVar27 = -3.4028235e+38;
    fVar28 = -3.4028235e+38;
    fVar29 = -3.4028235e+38;
    fVar30 = -3.4028235e+38;
    for (lVar17 = 0; uVar21 * 0x28 - lVar17 != 0; lVar17 = lVar17 + 0x28) {
      puVar5 = (ulong *)((long)puVar14 + lVar17 + 8);
      auVar32._0_8_ = *puVar5 & 0x7fffffff7fffffff;
      auVar32._8_4_ = (uint)puVar5[1] & 0x7fffffff;
      auVar32._12_4_ = *(uint *)((long)puVar5 + 0xc) & 0x7fffffff;
      auVar10._4_4_ = fVar28;
      auVar10._0_4_ = fVar27;
      auVar10._8_4_ = fVar29;
      auVar10._12_4_ = fVar30;
      auVar33 = maxps(auVar32,auVar10);
      auVar35._0_8_ = *(ulong *)((long)puVar14 + lVar17 + 0x18) & 0x7fffffff7fffffff;
      auVar35._8_8_ = 0;
      auVar9._4_4_ = fVar24;
      auVar9._0_4_ = fVar23;
      auVar9._8_4_ = fVar25;
      auVar9._12_4_ = fVar26;
      auVar36 = maxps(auVar35,auVar9);
      fVar27 = auVar33._0_4_;
      fVar28 = auVar33._4_4_;
      fVar29 = auVar33._8_4_;
      fVar30 = auVar33._12_4_;
      fVar23 = auVar36._0_4_;
      fVar24 = auVar36._4_4_;
      fVar25 = auVar36._8_4_;
      fVar26 = auVar36._12_4_;
    }
    auVar11._4_4_ = fVar28;
    auVar11._0_4_ = fVar27;
    auVar11._8_4_ = fVar29;
    auVar11._12_4_ = fVar30;
    auVar33 = divps(_DAT_001d5ef0,auVar11);
    fVar27 = (float)(-(uint)(fVar27 != 0.0) & auVar33._0_4_);
    fVar28 = (float)(-(uint)(fVar28 != 0.0) & auVar33._4_4_);
    fVar29 = (float)(-(uint)(fVar29 != 0.0) & auVar33._8_4_);
    fVar30 = (float)(-(uint)(fVar30 != 0.0) & auVar33._12_4_);
    auVar33._4_4_ = fVar24;
    auVar33._0_4_ = fVar23;
    auVar33._8_4_ = fVar25;
    auVar33._12_4_ = fVar26;
    auVar33 = divps(_DAT_001d5f00,auVar33);
    fVar23 = (float)(-(uint)(fVar23 != 0.0) & auVar33._0_4_);
    fVar24 = (float)(-(uint)(fVar24 != 0.0) & auVar33._4_4_);
    fVar25 = (float)(-(uint)(fVar25 != 0.0) & auVar33._8_4_);
    fVar26 = (float)(-(uint)(fVar26 != 0.0) & auVar33._12_4_);
    auVar12._4_4_ = fVar28;
    auVar12._0_4_ = fVar27;
    auVar12._8_4_ = fVar29;
    auVar12._12_4_ = fVar30;
    auVar33 = divps(_DAT_001d2d10,auVar12);
    (this->mCenterCoeff).x = (float)(auVar33._0_4_ & -(uint)(fVar27 != 0.0));
    (this->mCenterCoeff).y = (float)(auVar33._4_4_ & -(uint)(fVar28 != 0.0));
    (this->mCenterCoeff).z = (float)(auVar33._8_4_ & -(uint)(fVar29 != 0.0));
    (this->mExtentsCoeff).x = (float)(auVar33._12_4_ & -(uint)(fVar30 != 0.0));
    auVar36._4_4_ = fVar24;
    auVar36._0_4_ = fVar23;
    auVar36._8_4_ = fVar25;
    auVar36._12_4_ = fVar26;
    auVar33 = divps(_DAT_001c9a60,auVar36);
    (this->mExtentsCoeff).y = (float)(auVar33._0_4_ & -(uint)(fVar23 != 0.0));
    (this->mExtentsCoeff).z = (float)(auVar33._4_4_ & -(uint)(fVar24 != 0.0));
    for (uVar18 = 0; uVar18 != uVar21; uVar18 = uVar18 + 1) {
      pAVar2 = linear + uVar18;
      fVar6 = (pAVar2->mAABB).mCenter.x;
      fVar7 = (pAVar2->mAABB).mCenter.y;
      fVar31 = (pAVar2->mAABB).mCenter.z;
      fVar41 = (pAVar2->mAABB).mExtents.x;
      auVar37._0_4_ = (int)(fVar27 * fVar6);
      auVar37._4_4_ = (int)(fVar28 * fVar7);
      auVar37._8_4_ = (int)(fVar29 * fVar31);
      auVar37._12_4_ = (int)(fVar30 * fVar41);
      auVar33 = packssdw(auVar37,auVar37);
      uVar39 = auVar33._0_8_ & 0xffffffffffff | auVar37._6_8_ & 0xffff000000000000;
      pAVar3 = pAVar8 + uVar18;
      (pAVar3->mAABB).mCenter[0] = (short)uVar39;
      (pAVar3->mAABB).mCenter[1] = (short)(uVar39 >> 0x10);
      (pAVar3->mAABB).mCenter[2] = (short)(uVar39 >> 0x20);
      (pAVar3->mAABB).mExtents[0] = (short)(uVar39 >> 0x30);
      fVar34 = (float)puVar14[uVar18 * 5 + 3];
      fVar38 = (float)(puVar14[uVar18 * 5 + 3] >> 0x20);
      auVar40._0_4_ = (int)(fVar23 * fVar34);
      auVar40._4_4_ = (int)(fVar24 * fVar38);
      auVar40._8_4_ = (int)(fVar25 * 0.0);
      auVar40._12_4_ = (int)(fVar26 * 0.0);
      auVar33 = pshuflw(auVar40,auVar40,0xe8);
      *(int *)(puVar15 + uVar18 * 4 + 2) = auVar33._0_4_;
      local_40 = CONCAT44(fVar7 + fVar34,fVar6 + fVar41);
      local_38 = fVar31 + fVar38;
      local_50[0] = fVar6 - fVar41;
      local_50[1] = fVar7 - fVar34;
      local_50[2] = fVar31 - fVar38;
      for (lVar17 = 0; lVar17 != 3; lVar17 = lVar17 + 1) {
        psVar4 = pAVar8[uVar18].mAABB.mCenter + lVar17;
        puVar19 = (uword *)(psVar4 + 3);
        fVar31 = (float)(int)*psVar4 * (&(this->mCenterCoeff).x)[lVar17];
        fVar6 = (&(this->mExtentsCoeff).x)[lVar17];
        fVar7 = *(float *)((long)&local_40 + lVar17 * 4);
        uVar20 = *puVar19;
        do {
          fVar41 = (float)uVar20 * fVar6;
          if ((fVar7 <= fVar31 + fVar41) &&
             (fVar41 = fVar31 - fVar41, fVar41 < local_50[lVar17] || fVar41 == local_50[lVar17])) {
            if (uVar20 != 0) goto LAB_00193d38;
            break;
          }
          uVar20 = uVar20 + 1;
          *puVar19 = uVar20;
        } while (uVar20 != 0);
        *puVar19 = 0xffff;
LAB_00193d38:
      }
      uVar39 = linear[uVar18].mPosData;
      if ((uVar39 & 1) == 0) {
        uVar39 = (long)(pAVar8->mAABB).mCenter +
                 (ulong)((uint)((int)uVar39 - (int)linear) / 0x28 << 5);
      }
      puVar15[uVar18 * 4 + 3] = uVar39;
      uVar39 = linear[uVar18].mNegData;
      if ((uVar39 & 1) == 0) {
        uVar39 = (long)(pAVar8->mAABB).mCenter +
                 (ulong)((uint)((int)uVar39 - (int)linear) / 0x28 << 5);
      }
      puVar15[uVar18 * 4 + 4] = uVar39;
    }
    operator_delete__(puVar14,*puVar14 * 0x28 + 8);
    bVar13 = true;
  }
  else {
    bVar13 = false;
  }
  return bVar13;
}

Assistant:

bool AABBQuantizedNoLeafTree::Build(AABBTree* tree)
{
	// Checkings
	if(!tree)	return false;
	// Check the input tree is complete
	udword NbTriangles	= tree->GetNbPrimitives();
	udword NbNodes		= tree->GetNbNodes();
	if(NbNodes!=NbTriangles*2-1)	return false;

	// Get nodes
	mNbNodes = NbTriangles-1;
	DELETEARRAY(mNodes);
	AABBNoLeafNode* Nodes = new AABBNoLeafNode[mNbNodes];
	CHECKALLOC(Nodes);

	// Build the tree
	udword CurID = 1;
	_BuildNoLeafTree(Nodes, 0, CurID, tree);
	ASSERT(CurID==mNbNodes);

	// Quantize
	{
		mNodes = new AABBQuantizedNoLeafNode[mNbNodes];
		CHECKALLOC(mNodes);

		// Get max values
		FIND_MAX_VALUES

		// Quantization
		INIT_QUANTIZATION

		// Quantize
		uintptr_t Data;
		for(udword i=0;i<mNbNodes;i++)
		{
			PERFORM_QUANTIZATION
			REMAP_DATA(mPosData)
			REMAP_DATA(mNegData)
		}

		DELETEARRAY(Nodes);
	}

	return true;
}